

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSleepCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestSleepCommand::Clone(cmCTestSleepCommand *this)

{
  cmCommand *this_00;
  cmCTestSleepCommand *ni;
  cmCTestSleepCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x40);
  cmCTestSleepCommand((cmCTestSleepCommand *)this_00);
  this_00[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestCommand).CTest;
  this_00[1].Makefile = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestSleepCommand* ni = new cmCTestSleepCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }